

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json2xml.hpp
# Opt level: O3

bool __thiscall ert::JsonSaxConsumer::number_integer(JsonSaxConsumer *this,number_integer_t val)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  uint __len;
  ulong __val;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  _Quoted_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char>
  local_40;
  
  __val = -val;
  if (0 < val) {
    __val = val;
  }
  __len = 1;
  if (9 < __val) {
    uVar3 = __val;
    uVar2 = 4;
    do {
      __len = uVar2;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_00105e32;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_00105e32;
      }
      if (uVar3 < 10000) goto LAB_00105e32;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      uVar2 = __len + 4;
    } while (bVar1);
    __len = __len + 1;
  }
LAB_00105e32:
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_60,(char)__len - (char)(val >> 0x3f));
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_60._M_dataplus._M_p + -(val >> 0x3f),__len,__val);
  local_40._M_delim = '\"';
  local_40._M_escape = '\\';
  local_40._M_string = &local_60;
  std::__detail::operator<<
            ((basic_ostream<char,_std::char_traits<char>_> *)&this->field_0x1b0,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  this->has_attributes_ = true;
  return true;
}

Assistant:

bool number_integer(number_integer_t val) override
    {
        current_object_ << std::quoted(std::to_string(val));
        has_attributes_ = true;
        return true;
    }